

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objinfo.cpp
# Opt level: O2

bool findSymbolForName(symbol_section_accessor syms,Elf64_Addr *value,Elf_Half *section_index,
                      string *name)

{
  ulong uVar1;
  __type _Var2;
  Elf_Xword EVar3;
  ulong index;
  uchar other;
  uchar type;
  uchar bind;
  string candidateName;
  Elf_Xword size;
  
  candidateName._M_dataplus._M_p = (pointer)&candidateName.field_2;
  candidateName._M_string_length = 0;
  candidateName.field_2._M_local_buf[0] = '\0';
  EVar3 = ELFIO::symbol_section_accessor::get_symbols_num(&syms);
  uVar1 = 0;
  do {
    index = uVar1;
    if (EVar3 == index) break;
    ELFIO::symbol_section_accessor::get_symbol
              (&syms,index,&candidateName,value,&size,&bind,&type,section_index,&other);
    _Var2 = std::operator==(&candidateName,name);
    uVar1 = index + 1;
  } while (!_Var2);
  std::__cxx11::string::~string((string *)&candidateName);
  return index < EVar3;
}

Assistant:

bool findSymbolForName(ELFIO::symbol_section_accessor syms, ELFIO::Elf64_Addr &value, ELFIO::Elf_Half &section_index, std::string &name)
{
	ELFIO::Elf_Xword size;
	unsigned char bind;
	unsigned char type;
	unsigned char other;
	std::string candidateName;

	ELFIO::Elf_Xword numSymbols = syms.get_symbols_num();
	for(ELFIO::Elf_Xword i = 0; i < numSymbols; i++) {
		syms.get_symbol(i, candidateName, value, size, bind, type, section_index, other);
		if(candidateName == name) {
			return true;
		}
	}

	return false;
}